

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

mat4 * polyscope::view::getCameraPerspectiveMatrix(void)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  float fVar5;
  mat4 *in_RDI;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  float fVar9;
  double dVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  dVar2 = (double)state::lengthScale * farClipRatio;
  dVar3 = (double)state::lengthScale * nearClipRatio;
  fVar9 = (float)bufferWidth;
  fVar11 = (float)bufferHeight;
  if (projectionMode == 1) {
    dVar7 = tan(fov * 0.017453292519943295 * 0.5);
    dVar10 = (double)state::lengthScale;
    in_RDI->value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    in_RDI->value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    *(undefined8 *)&in_RDI->value[0].field_3 = 0;
    in_RDI->value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    in_RDI->value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    in_RDI->value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    in_RDI->value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    dVar7 = dVar7 * dVar10 + dVar7 * dVar10;
    in_RDI->value[2].field_2.z = (float)(-2.0 / (dVar2 - dVar3));
    in_RDI->value[2].field_3.w = 0.0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar7;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar7 * (double)(fVar9 / fVar11);
    auVar6 = vunpcklpd_avx(auVar13,auVar6);
    auVar14._0_8_ = auVar6._0_8_ + auVar6._0_8_;
    auVar14._8_8_ = auVar6._8_8_ + auVar6._8_8_;
    auVar6 = vsubpd_avx(auVar6,auVar6);
    auVar8._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
    auVar8._8_8_ = auVar6._8_8_ ^ 0x8000000000000000;
    auVar13 = vshufpd_avx(auVar14,auVar14,1);
    auVar6 = vdivpd_avx(auVar8,auVar14);
    auVar6 = vcvtpd2ps_avx(auVar6);
    in_RDI->value[0].field_0.x = (float)(2.0 / auVar14._0_8_);
    in_RDI->value[1].field_1.y = (float)(2.0 / auVar13._0_8_);
    uVar1 = vmovlps_avx(auVar6);
    in_RDI->value[3].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar1;
    in_RDI->value[3].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20)
    ;
    in_RDI->value[3].field_2.z = (float)(-(dVar3 + dVar2) / (dVar2 - dVar3));
    in_RDI->value[3].field_3.w = 1.0;
  }
  else {
    if (projectionMode == 0) {
      dVar7 = tan(fov * 0.017453292519943295 * 0.5);
      fVar5 = 0.0;
      auVar4._8_8_ = 0x8000000000000000;
      auVar4._0_8_ = 0x8000000000000000;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar3 + dVar2;
      auVar6 = vxorpd_avx512vl(auVar12,auVar4);
      in_RDI->value[0].field_0.x = (float)(1.0 / (dVar7 * (double)(fVar9 / fVar11)));
      *(undefined1 (*) [16])&in_RDI->value[0].field_1 = ZEXT816(0) << 0x20;
      in_RDI->value[1].field_1.y = (float)(1.0 / dVar7);
      *(undefined1 (*) [16])&in_RDI->value[1].field_2 = ZEXT816(0) << 0x20;
      in_RDI->value[2].field_2.z = (float)(auVar6._0_8_ / (dVar2 - dVar3));
      uVar1 = vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
      *(undefined8 *)&in_RDI->value[2].field_3 = uVar1;
      in_RDI->value[3].field_1.y = 0.0;
      in_RDI->value[3].field_2.z = (float)((dVar3 * dVar2 * -2.0) / (dVar2 - dVar3));
    }
    else {
      fVar5 = 1.0;
      auVar6 = ZEXT816(0) << 0x20;
      in_RDI->value[0].field_0.x = 1.0;
      *(undefined1 (*) [16])&in_RDI->value[0].field_1 = auVar6;
      in_RDI->value[1].field_1.y = 1.0;
      *(undefined1 (*) [16])&in_RDI->value[1].field_2 = auVar6;
      in_RDI->value[2].field_2.z = 1.0;
      *(undefined1 (*) [16])&in_RDI->value[2].field_3 = auVar6;
    }
    in_RDI->value[3].field_3.w = fVar5;
  }
  return in_RDI;
}

Assistant:

glm::mat4 getCameraPerspectiveMatrix() {
  double farClip = farClipRatio * state::lengthScale;
  double nearClip = nearClipRatio * state::lengthScale;
  double fovRad = glm::radians(fov);
  double aspectRatio = (float)bufferWidth / bufferHeight;
  switch (projectionMode) {
  case ProjectionMode::Perspective: {
    return glm::perspective(fovRad, aspectRatio, nearClip, farClip);
    break;
  }
  case ProjectionMode::Orthographic: {
    double vert = tan(fovRad / 2.) * state::lengthScale * 2.;
    double horiz = vert * aspectRatio;
    return glm::ortho(-horiz, horiz, -vert, vert, nearClip, farClip);
    break;
  }
  }
  return glm::mat4(1.0f); // unreachable
}